

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O1

void ssh2channel_request_agent_forwarding(SshChannel *sc,_Bool want_reply)

{
  SshChannelVtable *pSVar1;
  PktOut *pPVar2;
  cr_handler_fn_t handler;
  undefined7 in_register_00000031;
  
  pSVar1 = sc[-0xb].vt;
  handler = ssh2_channel_response;
  if ((int)CONCAT71(in_register_00000031,want_reply) == 0) {
    handler = (cr_handler_fn_t)0x0;
  }
  pPVar2 = ssh2_chanreq_init((ssh2_channel *)(sc + -0xb),"auth-agent-req@openssh.com",handler,
                             (void *)0x0);
  pq_base_push((PacketQueueBase *)pSVar1[1].request_agent_forwarding,&pPVar2->qnode);
  return;
}

Assistant:

void ssh2channel_request_agent_forwarding(SshChannel *sc, bool want_reply)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;

    PktOut *pktout = ssh2_chanreq_init(
        c, "auth-agent-req@openssh.com",
        want_reply ? ssh2_channel_response : NULL, NULL);
    pq_push(s->ppl.out_pq, pktout);
}